

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_true,_false>::append_edge_(DaTrie<true,_true,_false> *this,Query *query)

{
  uint8_t uVar1;
  pointer pBVar2;
  pointer pNVar3;
  uint32_t uVar4;
  uint node_pos;
  
  uVar4 = xcheck_(this,query->key_[query->pos_],&this->blocks_);
  node_pos = (byte)query->key_[query->pos_] ^ uVar4;
  fix_(this,node_pos,&this->blocks_);
  *(uint32_t *)
   ((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
    super__Vector_impl_data._M_start + query->node_pos_) = uVar4 & 0x7fffffff;
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar2[node_pos] =
       (Bc)((ulong)pBVar2[node_pos] & 0x80000000ffffffff |
           (ulong)(query->node_pos_ & 0x7fffffff) << 0x20);
  uVar1 = query->key_[query->pos_];
  pNVar3 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar3[query->node_pos_].child = uVar1;
  pNVar3[node_pos].sib = uVar1;
  query->node_pos_ = node_pos;
  Query::next(query);
  return;
}

Assistant:

void append_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto base = xcheck_(query.label(), blocks_);
    auto child_pos = base ^query.label();

    fix_(child_pos, blocks_);
    bc_[query.node_pos()].set_base(base);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      node_links_[query.node_pos()].child = query.label();
      node_links_[child_pos].sib = query.label();
    }
    query.next(child_pos);
  }